

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmidiin.cpp
# Opt level: O0

int main(int argc,char **param_2)

{
  bool bVar1;
  RtMidiIn *pRVar2;
  RtMidiError *error;
  string local_50 [5];
  char input;
  RtMidiIn *local_20;
  RtMidiIn *midiin;
  char **param_1_local;
  int argc_local;
  
  param_1_local._4_4_ = 0;
  local_20 = (RtMidiIn *)0x0;
  midiin = (RtMidiIn *)param_2;
  param_1_local._0_4_ = argc;
  if (2 < argc) {
    usage();
  }
  pRVar2 = (RtMidiIn *)operator_new(0x10);
  error._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"RtMidi Input Client",(allocator<char> *)((long)&error + 7));
  RtMidiIn::RtMidiIn(pRVar2,0,local_50);
  error._6_1_ = 0;
  local_20 = pRVar2;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&error + 7));
  bVar1 = chooseMidiPort(local_20);
  if (bVar1) {
    RtMidiIn::setCallback(local_20,mycallback,(void *)0x0);
    RtMidiIn::ignoreTypes(local_20,false,false,false);
    std::operator<<((ostream *)&std::cout,"\nReading MIDI input ... press <enter> to quit.\n");
    std::istream::get((char *)&std::cin);
  }
  if (local_20 != (RtMidiIn *)0x0) {
    (**(code **)(*(long *)local_20 + 0x40))();
  }
  return 0;
}

Assistant:

int main( int argc, char ** /*argv[]*/ )
{
  RtMidiIn *midiin = 0;

  // Minimal command-line check.
  if ( argc > 2 ) usage();

  try {

    // RtMidiIn constructor
    midiin = new RtMidiIn();

    // Call function to select port.
    if ( chooseMidiPort( midiin ) == false ) goto cleanup;

    // Set our callback function.  This should be done immediately after
    // opening the port to avoid having incoming messages written to the
    // queue instead of sent to the callback function.
    midiin->setCallback( &mycallback );

    // Don't ignore sysex, timing, or active sensing messages.
    midiin->ignoreTypes( false, false, false );

    std::cout << "\nReading MIDI input ... press <enter> to quit.\n";
    char input;
    std::cin.get(input);

  } catch ( RtMidiError &error ) {
    error.printMessage();
  }

 cleanup:

  delete midiin;

  return 0;
}